

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::
     LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [64],char (*args_1) [6],
               char (*args_2) [64],float *args_3,char (*args_4) [6],double *args_5)

{
  double *in_stack_ffffffffffffffb8;
  string local_40;
  
  StringPrintf<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
            (&local_40,(pbrt *)fmt,*args,(char (*) [64])args_1,(char (*) [6])args_2,
             (char (*) [64])args_3,(float *)args_4,(char (*) [6])args_5,in_stack_ffffffffffffffb8);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}